

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O0

ServiceDescriptor * perfetto::protos::gen::ConsumerPort::NewDescriptor(void)

{
  ServiceDescriptor *this;
  Method local_1d0;
  Method local_1b0;
  Method local_190;
  Method local_170;
  Method local_150;
  Method local_130;
  Method local_110;
  Method local_f0;
  Method local_d0;
  Method local_b0;
  Method local_90;
  Method local_70;
  Method local_50;
  Method local_30;
  ServiceDescriptor *local_10;
  ServiceDescriptor *desc;
  
  this = (ServiceDescriptor *)operator_new(0x20);
  memset(this,0,0x20);
  ipc::ServiceDescriptor::ServiceDescriptor(this);
  this->service_name = "ConsumerPort";
  local_30.name = "EnableTracing";
  local_30.request_proto_decoder = _IPC_Decoder<perfetto::protos::gen::EnableTracingRequest>;
  local_30.reply_proto_decoder = _IPC_Decoder<perfetto::protos::gen::EnableTracingResponse>;
  local_30.invoker =
       _IPC_Invoker<perfetto::protos::gen::ConsumerPort,_perfetto::protos::gen::EnableTracingRequest,_perfetto::protos::gen::EnableTracingResponse,_&perfetto::protos::gen::ConsumerPort::EnableTracing>
  ;
  local_10 = this;
  std::
  vector<perfetto::ipc::ServiceDescriptor::Method,_std::allocator<perfetto::ipc::ServiceDescriptor::Method>_>
  ::emplace_back<perfetto::ipc::ServiceDescriptor::Method>(&this->methods,&local_30);
  local_50.name = "DisableTracing";
  local_50.request_proto_decoder = _IPC_Decoder<perfetto::protos::gen::DisableTracingRequest>;
  local_50.reply_proto_decoder = _IPC_Decoder<perfetto::protos::gen::DisableTracingResponse>;
  local_50.invoker =
       _IPC_Invoker<perfetto::protos::gen::ConsumerPort,_perfetto::protos::gen::DisableTracingRequest,_perfetto::protos::gen::DisableTracingResponse,_&perfetto::protos::gen::ConsumerPort::DisableTracing>
  ;
  std::
  vector<perfetto::ipc::ServiceDescriptor::Method,_std::allocator<perfetto::ipc::ServiceDescriptor::Method>_>
  ::emplace_back<perfetto::ipc::ServiceDescriptor::Method>(&local_10->methods,&local_50);
  local_70.name = "ReadBuffers";
  local_70.request_proto_decoder = _IPC_Decoder<perfetto::protos::gen::ReadBuffersRequest>;
  local_70.reply_proto_decoder = _IPC_Decoder<perfetto::protos::gen::ReadBuffersResponse>;
  local_70.invoker =
       _IPC_Invoker<perfetto::protos::gen::ConsumerPort,_perfetto::protos::gen::ReadBuffersRequest,_perfetto::protos::gen::ReadBuffersResponse,_&perfetto::protos::gen::ConsumerPort::ReadBuffers>
  ;
  std::
  vector<perfetto::ipc::ServiceDescriptor::Method,_std::allocator<perfetto::ipc::ServiceDescriptor::Method>_>
  ::emplace_back<perfetto::ipc::ServiceDescriptor::Method>(&local_10->methods,&local_70);
  local_90.name = "FreeBuffers";
  local_90.request_proto_decoder = _IPC_Decoder<perfetto::protos::gen::FreeBuffersRequest>;
  local_90.reply_proto_decoder = _IPC_Decoder<perfetto::protos::gen::FreeBuffersResponse>;
  local_90.invoker =
       _IPC_Invoker<perfetto::protos::gen::ConsumerPort,_perfetto::protos::gen::FreeBuffersRequest,_perfetto::protos::gen::FreeBuffersResponse,_&perfetto::protos::gen::ConsumerPort::FreeBuffers>
  ;
  std::
  vector<perfetto::ipc::ServiceDescriptor::Method,_std::allocator<perfetto::ipc::ServiceDescriptor::Method>_>
  ::emplace_back<perfetto::ipc::ServiceDescriptor::Method>(&local_10->methods,&local_90);
  local_b0.name = "Flush";
  local_b0.request_proto_decoder = _IPC_Decoder<perfetto::protos::gen::FlushRequest>;
  local_b0.reply_proto_decoder = _IPC_Decoder<perfetto::protos::gen::FlushResponse>;
  local_b0.invoker =
       _IPC_Invoker<perfetto::protos::gen::ConsumerPort,_perfetto::protos::gen::FlushRequest,_perfetto::protos::gen::FlushResponse,_&perfetto::protos::gen::ConsumerPort::Flush>
  ;
  std::
  vector<perfetto::ipc::ServiceDescriptor::Method,_std::allocator<perfetto::ipc::ServiceDescriptor::Method>_>
  ::emplace_back<perfetto::ipc::ServiceDescriptor::Method>(&local_10->methods,&local_b0);
  local_d0.name = "StartTracing";
  local_d0.request_proto_decoder = _IPC_Decoder<perfetto::protos::gen::StartTracingRequest>;
  local_d0.reply_proto_decoder = _IPC_Decoder<perfetto::protos::gen::StartTracingResponse>;
  local_d0.invoker =
       _IPC_Invoker<perfetto::protos::gen::ConsumerPort,_perfetto::protos::gen::StartTracingRequest,_perfetto::protos::gen::StartTracingResponse,_&perfetto::protos::gen::ConsumerPort::StartTracing>
  ;
  std::
  vector<perfetto::ipc::ServiceDescriptor::Method,_std::allocator<perfetto::ipc::ServiceDescriptor::Method>_>
  ::emplace_back<perfetto::ipc::ServiceDescriptor::Method>(&local_10->methods,&local_d0);
  local_f0.name = "ChangeTraceConfig";
  local_f0.request_proto_decoder = _IPC_Decoder<perfetto::protos::gen::ChangeTraceConfigRequest>;
  local_f0.reply_proto_decoder = _IPC_Decoder<perfetto::protos::gen::ChangeTraceConfigResponse>;
  local_f0.invoker =
       _IPC_Invoker<perfetto::protos::gen::ConsumerPort,_perfetto::protos::gen::ChangeTraceConfigRequest,_perfetto::protos::gen::ChangeTraceConfigResponse,_&perfetto::protos::gen::ConsumerPort::ChangeTraceConfig>
  ;
  std::
  vector<perfetto::ipc::ServiceDescriptor::Method,_std::allocator<perfetto::ipc::ServiceDescriptor::Method>_>
  ::emplace_back<perfetto::ipc::ServiceDescriptor::Method>(&local_10->methods,&local_f0);
  local_110.name = "Detach";
  local_110.request_proto_decoder = _IPC_Decoder<perfetto::protos::gen::DetachRequest>;
  local_110.reply_proto_decoder = _IPC_Decoder<perfetto::protos::gen::DetachResponse>;
  local_110.invoker =
       _IPC_Invoker<perfetto::protos::gen::ConsumerPort,_perfetto::protos::gen::DetachRequest,_perfetto::protos::gen::DetachResponse,_&perfetto::protos::gen::ConsumerPort::Detach>
  ;
  std::
  vector<perfetto::ipc::ServiceDescriptor::Method,_std::allocator<perfetto::ipc::ServiceDescriptor::Method>_>
  ::emplace_back<perfetto::ipc::ServiceDescriptor::Method>(&local_10->methods,&local_110);
  local_130.name = "Attach";
  local_130.request_proto_decoder = _IPC_Decoder<perfetto::protos::gen::AttachRequest>;
  local_130.reply_proto_decoder = _IPC_Decoder<perfetto::protos::gen::AttachResponse>;
  local_130.invoker =
       _IPC_Invoker<perfetto::protos::gen::ConsumerPort,_perfetto::protos::gen::AttachRequest,_perfetto::protos::gen::AttachResponse,_&perfetto::protos::gen::ConsumerPort::Attach>
  ;
  std::
  vector<perfetto::ipc::ServiceDescriptor::Method,_std::allocator<perfetto::ipc::ServiceDescriptor::Method>_>
  ::emplace_back<perfetto::ipc::ServiceDescriptor::Method>(&local_10->methods,&local_130);
  local_150.name = "GetTraceStats";
  local_150.request_proto_decoder = _IPC_Decoder<perfetto::protos::gen::GetTraceStatsRequest>;
  local_150.reply_proto_decoder = _IPC_Decoder<perfetto::protos::gen::GetTraceStatsResponse>;
  local_150.invoker =
       _IPC_Invoker<perfetto::protos::gen::ConsumerPort,_perfetto::protos::gen::GetTraceStatsRequest,_perfetto::protos::gen::GetTraceStatsResponse,_&perfetto::protos::gen::ConsumerPort::GetTraceStats>
  ;
  std::
  vector<perfetto::ipc::ServiceDescriptor::Method,_std::allocator<perfetto::ipc::ServiceDescriptor::Method>_>
  ::emplace_back<perfetto::ipc::ServiceDescriptor::Method>(&local_10->methods,&local_150);
  local_170.name = "ObserveEvents";
  local_170.request_proto_decoder = _IPC_Decoder<perfetto::protos::gen::ObserveEventsRequest>;
  local_170.reply_proto_decoder = _IPC_Decoder<perfetto::protos::gen::ObserveEventsResponse>;
  local_170.invoker =
       _IPC_Invoker<perfetto::protos::gen::ConsumerPort,_perfetto::protos::gen::ObserveEventsRequest,_perfetto::protos::gen::ObserveEventsResponse,_&perfetto::protos::gen::ConsumerPort::ObserveEvents>
  ;
  std::
  vector<perfetto::ipc::ServiceDescriptor::Method,_std::allocator<perfetto::ipc::ServiceDescriptor::Method>_>
  ::emplace_back<perfetto::ipc::ServiceDescriptor::Method>(&local_10->methods,&local_170);
  local_190.name = "QueryServiceState";
  local_190.request_proto_decoder = _IPC_Decoder<perfetto::protos::gen::QueryServiceStateRequest>;
  local_190.reply_proto_decoder = _IPC_Decoder<perfetto::protos::gen::QueryServiceStateResponse>;
  local_190.invoker =
       _IPC_Invoker<perfetto::protos::gen::ConsumerPort,_perfetto::protos::gen::QueryServiceStateRequest,_perfetto::protos::gen::QueryServiceStateResponse,_&perfetto::protos::gen::ConsumerPort::QueryServiceState>
  ;
  std::
  vector<perfetto::ipc::ServiceDescriptor::Method,_std::allocator<perfetto::ipc::ServiceDescriptor::Method>_>
  ::emplace_back<perfetto::ipc::ServiceDescriptor::Method>(&local_10->methods,&local_190);
  local_1b0.name = "QueryCapabilities";
  local_1b0.request_proto_decoder = _IPC_Decoder<perfetto::protos::gen::QueryCapabilitiesRequest>;
  local_1b0.reply_proto_decoder = _IPC_Decoder<perfetto::protos::gen::QueryCapabilitiesResponse>;
  local_1b0.invoker =
       _IPC_Invoker<perfetto::protos::gen::ConsumerPort,_perfetto::protos::gen::QueryCapabilitiesRequest,_perfetto::protos::gen::QueryCapabilitiesResponse,_&perfetto::protos::gen::ConsumerPort::QueryCapabilities>
  ;
  std::
  vector<perfetto::ipc::ServiceDescriptor::Method,_std::allocator<perfetto::ipc::ServiceDescriptor::Method>_>
  ::emplace_back<perfetto::ipc::ServiceDescriptor::Method>(&local_10->methods,&local_1b0);
  local_1d0.name = "SaveTraceForBugreport";
  local_1d0.request_proto_decoder =
       _IPC_Decoder<perfetto::protos::gen::SaveTraceForBugreportRequest>;
  local_1d0.reply_proto_decoder = _IPC_Decoder<perfetto::protos::gen::SaveTraceForBugreportResponse>
  ;
  local_1d0.invoker =
       _IPC_Invoker<perfetto::protos::gen::ConsumerPort,_perfetto::protos::gen::SaveTraceForBugreportRequest,_perfetto::protos::gen::SaveTraceForBugreportResponse,_&perfetto::protos::gen::ConsumerPort::SaveTraceForBugreport>
  ;
  std::
  vector<perfetto::ipc::ServiceDescriptor::Method,_std::allocator<perfetto::ipc::ServiceDescriptor::Method>_>
  ::emplace_back<perfetto::ipc::ServiceDescriptor::Method>(&local_10->methods,&local_1d0);
  std::
  vector<perfetto::ipc::ServiceDescriptor::Method,_std::allocator<perfetto::ipc::ServiceDescriptor::Method>_>
  ::shrink_to_fit(&local_10->methods);
  return local_10;
}

Assistant:

::perfetto::ipc::ServiceDescriptor* ConsumerPort::NewDescriptor() {
  auto* desc = new ::perfetto::ipc::ServiceDescriptor();
  desc->service_name = "ConsumerPort";

  desc->methods.emplace_back(::perfetto::ipc::ServiceDescriptor::Method{
     "EnableTracing",
     &_IPC_Decoder<EnableTracingRequest>,
     &_IPC_Decoder<EnableTracingResponse>,
     &_IPC_Invoker<ConsumerPort, EnableTracingRequest, EnableTracingResponse, &ConsumerPort::EnableTracing>});

  desc->methods.emplace_back(::perfetto::ipc::ServiceDescriptor::Method{
     "DisableTracing",
     &_IPC_Decoder<DisableTracingRequest>,
     &_IPC_Decoder<DisableTracingResponse>,
     &_IPC_Invoker<ConsumerPort, DisableTracingRequest, DisableTracingResponse, &ConsumerPort::DisableTracing>});

  desc->methods.emplace_back(::perfetto::ipc::ServiceDescriptor::Method{
     "ReadBuffers",
     &_IPC_Decoder<ReadBuffersRequest>,
     &_IPC_Decoder<ReadBuffersResponse>,
     &_IPC_Invoker<ConsumerPort, ReadBuffersRequest, ReadBuffersResponse, &ConsumerPort::ReadBuffers>});

  desc->methods.emplace_back(::perfetto::ipc::ServiceDescriptor::Method{
     "FreeBuffers",
     &_IPC_Decoder<FreeBuffersRequest>,
     &_IPC_Decoder<FreeBuffersResponse>,
     &_IPC_Invoker<ConsumerPort, FreeBuffersRequest, FreeBuffersResponse, &ConsumerPort::FreeBuffers>});

  desc->methods.emplace_back(::perfetto::ipc::ServiceDescriptor::Method{
     "Flush",
     &_IPC_Decoder<FlushRequest>,
     &_IPC_Decoder<FlushResponse>,
     &_IPC_Invoker<ConsumerPort, FlushRequest, FlushResponse, &ConsumerPort::Flush>});

  desc->methods.emplace_back(::perfetto::ipc::ServiceDescriptor::Method{
     "StartTracing",
     &_IPC_Decoder<StartTracingRequest>,
     &_IPC_Decoder<StartTracingResponse>,
     &_IPC_Invoker<ConsumerPort, StartTracingRequest, StartTracingResponse, &ConsumerPort::StartTracing>});

  desc->methods.emplace_back(::perfetto::ipc::ServiceDescriptor::Method{
     "ChangeTraceConfig",
     &_IPC_Decoder<ChangeTraceConfigRequest>,
     &_IPC_Decoder<ChangeTraceConfigResponse>,
     &_IPC_Invoker<ConsumerPort, ChangeTraceConfigRequest, ChangeTraceConfigResponse, &ConsumerPort::ChangeTraceConfig>});

  desc->methods.emplace_back(::perfetto::ipc::ServiceDescriptor::Method{
     "Detach",
     &_IPC_Decoder<DetachRequest>,
     &_IPC_Decoder<DetachResponse>,
     &_IPC_Invoker<ConsumerPort, DetachRequest, DetachResponse, &ConsumerPort::Detach>});

  desc->methods.emplace_back(::perfetto::ipc::ServiceDescriptor::Method{
     "Attach",
     &_IPC_Decoder<AttachRequest>,
     &_IPC_Decoder<AttachResponse>,
     &_IPC_Invoker<ConsumerPort, AttachRequest, AttachResponse, &ConsumerPort::Attach>});

  desc->methods.emplace_back(::perfetto::ipc::ServiceDescriptor::Method{
     "GetTraceStats",
     &_IPC_Decoder<GetTraceStatsRequest>,
     &_IPC_Decoder<GetTraceStatsResponse>,
     &_IPC_Invoker<ConsumerPort, GetTraceStatsRequest, GetTraceStatsResponse, &ConsumerPort::GetTraceStats>});

  desc->methods.emplace_back(::perfetto::ipc::ServiceDescriptor::Method{
     "ObserveEvents",
     &_IPC_Decoder<ObserveEventsRequest>,
     &_IPC_Decoder<ObserveEventsResponse>,
     &_IPC_Invoker<ConsumerPort, ObserveEventsRequest, ObserveEventsResponse, &ConsumerPort::ObserveEvents>});

  desc->methods.emplace_back(::perfetto::ipc::ServiceDescriptor::Method{
     "QueryServiceState",
     &_IPC_Decoder<QueryServiceStateRequest>,
     &_IPC_Decoder<QueryServiceStateResponse>,
     &_IPC_Invoker<ConsumerPort, QueryServiceStateRequest, QueryServiceStateResponse, &ConsumerPort::QueryServiceState>});

  desc->methods.emplace_back(::perfetto::ipc::ServiceDescriptor::Method{
     "QueryCapabilities",
     &_IPC_Decoder<QueryCapabilitiesRequest>,
     &_IPC_Decoder<QueryCapabilitiesResponse>,
     &_IPC_Invoker<ConsumerPort, QueryCapabilitiesRequest, QueryCapabilitiesResponse, &ConsumerPort::QueryCapabilities>});

  desc->methods.emplace_back(::perfetto::ipc::ServiceDescriptor::Method{
     "SaveTraceForBugreport",
     &_IPC_Decoder<SaveTraceForBugreportRequest>,
     &_IPC_Decoder<SaveTraceForBugreportResponse>,
     &_IPC_Invoker<ConsumerPort, SaveTraceForBugreportRequest, SaveTraceForBugreportResponse, &ConsumerPort::SaveTraceForBugreport>});
  desc->methods.shrink_to_fit();
  return desc;
}